

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::ActionBuf::execute(ActionBuf *this,Rdma *rdma)

{
  A2A *a2a;
  int iVar1;
  uint uVar2;
  int pid;
  int __fd;
  pointer pAVar3;
  long lVar4;
  unsigned_long x;
  long lVar5;
  unsigned_long uVar6;
  void *pvVar7;
  long lVar8;
  void *__buf;
  long lVar9;
  unsigned_long x_00;
  Category c;
  ulong uVar10;
  unsigned_long in_R8;
  TicToc local_50;
  
  lVar8 = (long)rdma->m_pid;
  a2a = &rdma->m_second_exchange;
  lVar9 = 0x30;
  uVar10 = 0;
  do {
    pAVar3 = (this->m_actions).
             super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_actions).
                       super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3) / 0x38) <= uVar10)
    {
      return;
    }
    iVar1 = *(int *)((long)pAVar3 + lVar9 + -0x30);
    uVar2 = *(uint *)((long)pAVar3 + lVar9 + -0x28);
    pid = *(int *)((long)pAVar3 + lVar9 + -0x24);
    __buf = (void *)(long)pid;
    __fd = *(int *)((long)pAVar3 + lVar9 + -0x20);
    lVar4 = *(long *)((long)pAVar3 + lVar9 + -0x18);
    x = *(unsigned_long *)((long)pAVar3 + lVar9 + -0x10);
    lVar5 = *(long *)((long)pAVar3 + lVar9 + -8);
    x_00 = *(unsigned_long *)((long)&pAVar3->kind + lVar9);
    c = (iVar1 != 1) + HPPUT;
    if (iVar1 == 0) {
      c = GET;
    }
    TicToc::TicToc(&local_50,c,0);
    if (iVar1 == 2) {
      in_R8 = x_00;
      Unbuf::send(&rdma->m_unbuf,__fd,__buf,
                  lVar5 + (long)(rdma->m_used_slots).
                                super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [lVar4 * rdma->m_nprocs + lVar8].addr,(int)x_00);
LAB_0010edcc:
      local_50.m_nbytes = x_00 + local_50.m_nbytes;
    }
    else {
      if (iVar1 == 1) {
        in_R8 = x_00;
        Unbuf::recv(&rdma->m_unbuf,__fd,(void *)(ulong)uVar2,
                    lVar5 + (long)(rdma->m_used_slots).
                                  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [x * (long)rdma->m_nprocs + lVar8].addr,(int)x_00);
        goto LAB_0010edcc;
      }
      if (iVar1 == 0) {
        uVar6 = (rdma->m_second_exchange).m_send_sizes.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[(long)__buf];
        pvVar7 = (rdma->m_used_slots).
                 super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar4 * rdma->m_nprocs + lVar8].addr;
        serial<unsigned_long>(a2a,pid,x_00);
        serial<unsigned_long>(a2a,pid,x);
        A2A::send(a2a,pid,(void *)(lVar5 + (long)pvVar7),x_00,(int)in_R8);
        x_00 = (rdma->m_second_exchange).m_send_sizes.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[(long)__buf] - uVar6;
        goto LAB_0010edcc;
      }
    }
    TicToc::~TicToc(&local_50);
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x38;
  } while( true );
}

Assistant:

void Rdma::ActionBuf::execute( Rdma & rdma )
{
    const int pid = rdma.m_pid;
    for (size_t i = 0; i < m_actions.size(); ++i ) 
    {
        Action a = m_actions[i];
#ifdef PROFILE
        TicToc t( a.kind==Action::GET? TicToc::GET:
                  a.kind==Action::HPPUT? TicToc::HPPUT:
                  TicToc::HPGET );
#endif
        switch( a.kind ) {
            case Action::GET : {
#ifdef PROFILE
                size_t start=rdma.m_second_exchange.send_size(a.dst_pid);
#endif
                char * addr = static_cast< char *>( 
                        rdma.slot( pid, a.src_slot ).addr );
                addr += a.offset;
                serial( rdma.m_second_exchange, a.dst_pid, a.size );
                serial( rdma.m_second_exchange, a.dst_pid, a.dst_slot );
                rdma.m_second_exchange.send( a.dst_pid, addr, a.size );
#ifdef PROFILE
                size_t end=rdma.m_second_exchange.send_size(a.dst_pid);
                t.add_bytes(end-start);
#endif
                break;
            }

            case Action::HPPUT : {
                char * addr = static_cast< char *>(
                        rdma.slot( pid, a.dst_slot ).addr );
                addr += a.offset;
                rdma.m_unbuf.recv( a.tag, a.src_pid, addr, a.size );
#ifdef PROFILE
                t.add_bytes(a.size);
#endif
                break;
            }

            case Action::HPGET : {
                char * addr = static_cast< char *>(
                        rdma.slot( pid, a.src_slot ).addr );
                addr += a.offset;
                rdma.m_unbuf.send( a.tag, a.dst_pid, addr, a.size );
#ifdef PROFILE
                t.add_bytes(a.size);
#endif
                break;
            }
        }
    }
}